

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error reallocate_t1_table(PS_Table table,FT_Offset new_size)

{
  FT_Pointer pvVar1;
  int local_34;
  FT_Byte *pFStack_30;
  FT_Error error;
  FT_Byte *old_base;
  FT_Memory memory;
  FT_Offset new_size_local;
  PS_Table table_local;
  
  old_base = (FT_Byte *)table->memory;
  pFStack_30 = table->block;
  memory = (FT_Memory)new_size;
  new_size_local = (FT_Offset)table;
  pvVar1 = ft_mem_alloc((FT_Memory)old_base,new_size,&local_34);
  *(FT_Pointer *)new_size_local = pvVar1;
  if (local_34 == 0) {
    if (pFStack_30 != (FT_Byte *)0x0) {
      memcpy(*(void **)new_size_local,pFStack_30,*(size_t *)(new_size_local + 0x10));
      shift_elements((PS_Table)new_size_local,pFStack_30);
      ft_mem_free((FT_Memory)old_base,pFStack_30);
    }
    *(FT_Memory *)(new_size_local + 0x10) = memory;
    table_local._4_4_ = 0;
  }
  else {
    *(FT_Byte **)new_size_local = pFStack_30;
    table_local._4_4_ = local_34;
  }
  return table_local._4_4_;
}

Assistant:

static FT_Error
  reallocate_t1_table( PS_Table   table,
                       FT_Offset  new_size )
  {
    FT_Memory  memory   = table->memory;
    FT_Byte*   old_base = table->block;
    FT_Error   error;


    /* allocate new base block */
    if ( FT_ALLOC( table->block, new_size ) )
    {
      table->block = old_base;
      return error;
    }

    /* copy elements and shift offsets */
    if ( old_base )
    {
      FT_MEM_COPY( table->block, old_base, table->capacity );
      shift_elements( table, old_base );
      FT_FREE( old_base );
    }

    table->capacity = new_size;

    return FT_Err_Ok;
  }